

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

void * rw::copyMaterialMatFX(void *dst,void *src,int32 offset,int32 param_4)

{
  int iVar1;
  void *__src;
  void *__dest;
  int local_3c;
  int i;
  MatFX *dstfx;
  MatFX *srcfx;
  int32 param_3_local;
  int32 offset_local;
  void *src_local;
  void *dst_local;
  
  __src = *(void **)((long)src + (long)offset);
  if (__src != (void *)0x0) {
    __dest = mustmalloc_LOC(0x58,0x30120,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/matfx.cpp line: 376"
                           );
    *(void **)((long)dst + (long)offset) = __dest;
    memcpy(__dest,__src,0x58);
    for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
      iVar1 = *(int *)((long)__dest + (long)local_3c * 0x28);
      if (iVar1 == 1) {
        if (*(long *)((long)__dest + (long)local_3c * 0x28 + 0x10) != 0) {
          Texture::addRef(*(Texture **)((long)__dest + (long)local_3c * 0x28 + 0x10));
        }
        if (*(long *)((long)__dest + (long)local_3c * 0x28 + 0x18) != 0) {
          Texture::addRef(*(Texture **)((long)__dest + (long)local_3c * 0x28 + 0x18));
        }
      }
      else if (iVar1 == 2) {
        if (*(long *)((long)__dest + (long)local_3c * 0x28 + 0x10) != 0) {
          Texture::addRef(*(Texture **)((long)__dest + (long)local_3c * 0x28 + 0x10));
        }
      }
      else if ((iVar1 == 4) && (*(long *)((long)__dest + (long)local_3c * 0x28 + 8) != 0)) {
        Texture::addRef(*(Texture **)((long)__dest + (long)local_3c * 0x28 + 8));
      }
    }
  }
  return dst;
}

Assistant:

static void*
copyMaterialMatFX(void *dst, void *src, int32 offset, int32)
{
	MatFX *srcfx = *PLUGINOFFSET(MatFX*, src, offset);
	if(srcfx == nil)
		return dst;
	MatFX *dstfx = rwNewT(MatFX, 1, MEMDUR_EVENT | ID_MATFX);
	*PLUGINOFFSET(MatFX*, dst, offset) = dstfx;
	memcpy(dstfx, srcfx, sizeof(MatFX));
	for(int i = 0; i < 2; i++)
		switch(dstfx->fx[i].type){
		case MatFX::BUMPMAP:
			if(dstfx->fx[i].bump.bumpedTex)
				dstfx->fx[i].bump.bumpedTex->addRef();
			if(dstfx->fx[i].bump.tex)
				dstfx->fx[i].bump.tex->addRef();
			break;

		case MatFX::ENVMAP:
			if(dstfx->fx[i].env.tex)
				dstfx->fx[i].env.tex->addRef();
			break;

		case MatFX::DUAL:
			if(dstfx->fx[i].dual.tex)
				dstfx->fx[i].dual.tex->addRef();
			break;
		}
	return dst;
}